

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyImplPrivate::_q_startOperation(QNetworkReplyImplPrivate *this)

{
  int *piVar1;
  QDebug this_00;
  char cVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QAnyStringView QVar5;
  QDebug local_88;
  int local_80;
  QChar local_78;
  InternalNotifications local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined4 local_5c;
  char *local_58;
  QUrl local_50;
  undefined1 local_48 [8];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->state & ~Buffering) == Working) {
    local_70 = 2;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    local_5c = 0;
    local_58 = "default";
    QMessageLogger::debug();
    this_00.stream = local_88.stream;
    QVar4.m_data = (storage_type *)0x3e;
    QVar4.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_88.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_88.stream,' ');
    }
    local_50.d = (QUrlPrivate *)local_88.stream;
    *(int *)(local_88.stream + 0x28) = *(int *)(local_88.stream + 0x28) + 1;
    ::operator<<((Stream *)local_48,&local_50);
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug(&local_88);
  }
  else {
    this->state = Working;
    if (this->backend == (QNetworkAccessBackend *)0x0) {
      QCoreApplication::translate((char *)local_40,"QNetworkReply","Protocol \"%1\" is unknown",0);
      QUrl::scheme();
      QVar5.m_size = (size_t)local_40;
      QVar5.field_0.m_data = &local_70;
      QString::arg_impl(QVar5,local_80,local_78);
      error(this,ProtocolUnknownError,(QString *)&local_70);
      piVar1 = (int *)CONCAT44(uStack_6c,local_70);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),2,0x10);
        }
      }
      if ((QArrayData *)local_88.stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_88.stream = *(int *)local_88.stream + -1;
        UNLOCK();
        if (*(int *)local_88.stream == 0) {
          QArrayData::deallocate((QArrayData *)local_88.stream,2,0x10);
        }
      }
      if (local_40[0] != (QArrayData *)0x0) {
        LOCK();
        (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40[0],2,0x10);
        }
      }
      finished(this);
    }
    else {
      cVar2 = (**(code **)(*(long *)this->backend + 0x60))();
      if (cVar2 == '\0') {
        _q_startOperation();
      }
      else {
        QElapsedTimer::start();
        QElapsedTimer::invalidate();
        if ((QNetworkAccessBackend *)this->backend != (QNetworkAccessBackend *)0x0) {
          bVar3 = QNetworkAccessBackend::isSynchronous((QNetworkAccessBackend *)this->backend);
          if (bVar3) {
            this->state = Finished;
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              QNetworkReply::setFinished
                        (*(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8,true);
              return;
            }
            goto LAB_001999db;
          }
        }
        if (this->state != Finished) {
          if ((this->super_QNetworkReplyPrivate).operation == GetOperation) {
            local_70 = NotifyDownstreamReadyWrite;
            std::
            vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
            ::emplace_back<QNetworkReplyImplPrivate::InternalNotifications>
                      (&this->pendingNotifications,&local_70);
          }
          handleNotifications(this);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001999db:
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::_q_startOperation()
{
    // ensure this function is only being called once
    if (state == Working || state == Finished) {
        qDebug() << "QNetworkReplyImpl::_q_startOperation was called more than once" << url;
        return;
    }
    state = Working;

    // note: if that method is called directly, it cannot happen that the backend is 0,
    // because we just checked via a qobject_cast that we got a http backend (see
    // QNetworkReplyImplPrivate::setup())
    if (!backend) {
        error(QNetworkReplyImpl::ProtocolUnknownError,
              QCoreApplication::translate("QNetworkReply", "Protocol \"%1\" is unknown").arg(url.scheme())); // not really true!;
        finished();
        return;
    }

    if (!backend->start()) {
        qWarning("Backend start failed");
        state = Working;
        error(QNetworkReplyImpl::UnknownNetworkError,
              QCoreApplication::translate("QNetworkReply", "backend start error."));
        finished();
        return;
    }

    // Prepare timer for progress notifications
    downloadProgressSignalChoke.start();
    uploadProgressSignalChoke.invalidate();

    if (backend && backend->isSynchronous()) {
        state = Finished;
        q_func()->setFinished(true);
    } else {
        if (state != Finished) {
            if (operation == QNetworkAccessManager::GetOperation)
                pendingNotifications.push_back(NotifyDownstreamReadyWrite);

            handleNotifications();
        }
    }
}